

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

void * mpp_dec_hal_thread(void *data)

{
  int index_00;
  MppThreadStatus MVar1;
  MPP_RET MVar2;
  Mutex *mutex;
  RK_S32 status;
  uint local_10c;
  RK_S32 index;
  RK_U32 i;
  RK_U32 local_e8;
  int local_e4;
  RK_U32 notify_flag;
  AutoMutex work_lock;
  HalDecTask *task_dec;
  HalTaskInfo task_info;
  HalTaskHnd task;
  MppBufSlots packet_slots;
  MppBufSlots frame_slots;
  HalTaskGroup tasks;
  MppThread *hal;
  MppDecImpl *dec;
  Mpp *mpp;
  void *data_local;
  
  hal = *(MppThread **)((long)data + 0xa8);
  tasks = hal->mMutexCond[0].mLock.mMutex.__data.__list.__next;
  frame_slots = hal->mMutexCond[1].mLock.mMutex.__data.__list.__prev;
  packet_slots = *(MppBufSlots *)&hal->mMutexCond[0].mCondition.mCond.__data.__wseq;
  task = *(HalTaskHnd *)&hal->mMutexCond[0].mCondition.mCond.__data.__g1_start;
  task_info._120_8_ = 0;
  work_lock.mLock = (Mutex *)&task_dec;
  dec = (MppDecImpl *)data;
  mpp = (Mpp *)data;
  mpp_clock_start(*(MppClock *)((long)&hal[1].mMutexCond[2].mLock.mMutex + 0x10));
  do {
    while( true ) {
      mutex = MppThread::mutex((MppThread *)tasks,THREAD_WORK);
      Mutex::Autolock::Autolock((Autolock *)&notify_flag,mutex,1);
      MVar1 = MppThread::get_status((MppThread *)tasks,THREAD_WORK);
      if (MVar1 == MPP_THREAD_RUNNING) {
        MVar2 = hal_task_get_hnd(frame_slots,1,(HalTaskHnd *)(task_info.dec.refer + 0x10));
        if (MVar2 == MPP_OK) {
          local_e4 = 0;
        }
        else if (hal[1].mMutexCond[0].mLock.mMutex.__data.__nusers ==
                 hal[1].mMutexCond[0].mLock.mMutex.__data.__kind) {
          mpp_dec_notify(hal,0x80);
          mpp_clock_start(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__prev);
          MppThread::wait((MppThread *)tasks,(void *)0x0);
          mpp_clock_pause(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__prev);
          local_e4 = 2;
        }
        else {
          if ((mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: hal reset start\n",(char *)0x0);
          }
          reset_hal_thread((Mpp *)dec);
          if ((mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: hal reset done\n",(char *)0x0);
          }
          hal[1].mMutexCond[0].mLock.mMutex.__data.__kind =
               hal[1].mMutexCond[0].mLock.mMutex.__data.__kind + 1;
          sem_post((sem_t *)((long)&hal[1].mMutexCond[0].mCondition.mCond + 0x10));
          local_e4 = 2;
        }
      }
      else {
        local_e4 = 3;
      }
      Mutex::Autolock::~Autolock((Autolock *)&notify_flag);
      if (local_e4 != 0) break;
      if (task_info._120_8_ != 0) {
        mpp_clock_start(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__next);
        *(int *)((long)&dec->frame_slots + 4) = *(int *)((long)&dec->frame_slots + 4) + 1;
        hal_task_hnd_get_info((HalTaskHnd)task_info._120_8_,&task_dec);
        if ((*(ulong *)((long)&(work_lock.mLock)->mMutex + 8) >> 1 & 1) == 0) {
          if ((((undefined1  [40])(work_lock.mLock)->mMutex & (undefined1  [40])0x1) ==
               (undefined1  [40])0x0) ||
             ((((work_lock.mLock)->mMutex).__data.__lock != 0 &&
              (-1 < (int)work_lock.mLock[1].mMutex.__data.__nusers)))) {
            mpp_clock_start((MppClock)hal[1].mMutexCond[2].mCondition.mCond.__data.__wseq);
            mpp_hal_hw_wait(*(MppHal *)((long)&hal->mMutexCond[0].mLock.mMutex + 0x10),
                            (HalTaskInfo *)&task_dec);
            mpp_clock_pause((MppClock)hal[1].mMutexCond[2].mCondition.mCond.__data.__wseq);
            *(int *)((long)&hal[1].mMutexCond[2].mCondition.mCond + 0xc) =
                 *(int *)((long)&hal[1].mMutexCond[2].mCondition.mCond + 0xc) + 1;
            mpp_buf_slot_clr_flag(task,work_lock.mLock[1].mMutex.__data.__count,SLOT_HAL_INPUT);
            status = 2;
            if (hal[1].mMutexCond[1].mLock.mMutex.__data.__lock != 0) {
              status = 0;
            }
            hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,status);
            if (hal[1].mMutexCond[1].mLock.mMutex.__data.__lock == 0) {
              local_e8 = 0x300;
            }
            else {
              local_e8 = 0x100;
            }
            task_info._120_8_ = 0;
            if (-1 < (int)work_lock.mLock[1].mMutex.__data.__nusers) {
              mpp_buf_slot_clr_flag
                        (packet_slots,work_lock.mLock[1].mMutex.__data.__nusers,SLOT_HAL_OUTPUT);
            }
            for (local_10c = 0; local_10c < 0x11; local_10c = local_10c + 1) {
              index_00 = *(int *)((long)&work_lock.mLock[1].mMutex + (ulong)local_10c * 4 + 0x10);
              if (-1 < index_00) {
                mpp_buf_slot_clr_flag(packet_slots,index_00,SLOT_HAL_INPUT);
              }
            }
            if (((undefined1  [40])(work_lock.mLock)->mMutex & (undefined1  [40])0x1) !=
                (undefined1  [40])0x0) {
              mpp_dec_flush(hal);
            }
            mpp_dec_push_display
                      ((Mpp *)dec,*(HalDecTaskFlag *)((long)&(work_lock.mLock)->mMutex + 8));
            mpp_dec_notify(hal,local_e8);
            mpp_clock_pause(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__next);
          }
          else {
            mpp_dec_push_display
                      ((Mpp *)dec,*(HalDecTaskFlag *)((long)&(work_lock.mLock)->mMutex + 8));
            mpp_dec_put_frame((Mpp *)dec,-1,
                              *(HalDecTaskFlag *)((long)&(work_lock.mLock)->mMutex + 8));
            hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,0);
            task_info._120_8_ = 0;
            mpp_dec_notify(hal,0x100);
            mpp_clock_pause(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__next);
          }
        }
        else {
          mpp_dec_flush(hal);
          mpp_dec_push_display((Mpp *)dec,*(HalDecTaskFlag *)((long)&(work_lock.mLock)->mMutex + 8))
          ;
          mpp_dec_put_frame((Mpp *)dec,work_lock.mLock[1].mMutex.__data.__nusers,
                            *(HalDecTaskFlag *)((long)&(work_lock.mLock)->mMutex + 8));
          hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,0);
          task_info._120_8_ = 0;
          mpp_dec_notify(hal,0x100);
          mpp_clock_pause(hal[1].mMutexCond[2].mLock.mMutex.__data.__list.__next);
        }
      }
    }
  } while (local_e4 == 2);
  mpp_clock_pause(*(MppClock *)((long)&hal[1].mMutexCond[2].mLock.mMutex + 0x10));
  if ((*(int *)&dec->frame_slots != *(int *)((long)&dec->frame_slots + 4)) &&
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mpp->mTaskPutCount == mpp->mTaskGetCount","mpp_dec_hal_thread",0x38d),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_hal_thread exited\n",(char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *mpp_dec_hal_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *hal = dec->thread_hal;
    HalTaskGroup tasks = dec->tasks;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;

    HalTaskHnd  task = NULL;
    HalTaskInfo task_info;
    HalDecTask  *task_dec = &task_info.dec;

    mpp_clock_start(dec->clocks[DEC_HAL_TOTAL]);

    while (1) {
        /* hal thread wait for dxva interface intput first */
        {
            AutoMutex work_lock(hal->mutex());
            if (MPP_THREAD_RUNNING != hal->get_status())
                break;

            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                // process all task then do reset process
                if (dec->hal_reset_post != dec->hal_reset_done) {
                    dec_dbg_reset("reset: hal reset start\n");
                    reset_hal_thread(mpp);
                    dec_dbg_reset("reset: hal reset done\n");
                    dec->hal_reset_done++;
                    sem_post(&dec->hal_reset);
                    continue;
                }

                mpp_dec_notify(dec, MPP_DEC_NOTIFY_TASK_ALL_DONE);
                mpp_clock_start(dec->clocks[DEC_HAL_WAIT]);
                hal->wait();
                mpp_clock_pause(dec->clocks[DEC_HAL_WAIT]);
                continue;
            }
        }

        if (task) {
            RK_U32 notify_flag = MPP_DEC_NOTIFY_TASK_HND_VALID;

            mpp_clock_start(dec->clocks[DEC_HAL_PROC]);
            mpp->mTaskGetCount++;

            hal_task_hnd_get_info(task, &task_info);

            /*
             * check info change flag
             * if this is a frame with that flag, only output an empty
             * MppFrame without any image data for info change.
             */
            if (task_dec->flags.info_change) {
                mpp_dec_flush(dec);
                mpp_dec_push_display(mpp, task_dec->flags);
                mpp_dec_put_frame(mpp, task_dec->output, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }
            /*
             * check eos task
             * if this task is invalid while eos flag is set, we will
             * flush display queue then push the eos frame to info that
             * all frames have decoded.
             */
            if (task_dec->flags.eos &&
                (!task_dec->valid || task_dec->output < 0)) {
                mpp_dec_push_display(mpp, task_dec->flags);
                /*
                 * Use -1 as invalid buffer slot index.
                 * Reason: the last task maybe is a empty task with eos flag
                 * only but this task may go through vproc process also. We need
                 * create a buffer slot index for it.
                 */
                mpp_dec_put_frame(mpp, -1, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }

            mpp_clock_start(dec->clocks[DEC_HW_WAIT]);
            mpp_hal_hw_wait(dec->hal, &task_info);
            mpp_clock_pause(dec->clocks[DEC_HW_WAIT]);
            dec->dec_hw_run_count++;

            /*
             * when hardware decoding is done:
             * 1. clear decoding flag (mark buffer is ready)
             * 2. use get_display to get a new frame with buffer
             * 3. add frame to output list
             * repeat 2 and 3 until not frame can be output
             */
            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,
                                  SLOT_HAL_INPUT);

            hal_task_hnd_set_status(task, (dec->parser_fast_mode) ?
                                    (TASK_IDLE) : (TASK_PROC_DONE));

            if (dec->parser_fast_mode)
                notify_flag |= MPP_DEC_NOTIFY_TASK_HND_VALID;
            else
                notify_flag |= MPP_DEC_NOTIFY_TASK_PREV_DONE;

            task = NULL;

            if (task_dec->output >= 0)
                mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);

            for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(task_dec->refer); i++) {
                RK_S32 index = task_dec->refer[i];
                if (index >= 0)
                    mpp_buf_slot_clr_flag(frame_slots, index, SLOT_HAL_INPUT);
            }
            if (task_dec->flags.eos)
                mpp_dec_flush(dec);
            mpp_dec_push_display(mpp, task_dec->flags);

            mpp_dec_notify(dec, notify_flag);
            mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
        }
    }

    mpp_clock_pause(dec->clocks[DEC_HAL_TOTAL]);

    mpp_assert(mpp->mTaskPutCount == mpp->mTaskGetCount);
    mpp_dbg_info("mpp_dec_hal_thread exited\n");
    return NULL;
}